

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threading.cpp
# Opt level: O3

void __thiscall senjo::Mutex::Mutex(Mutex *this)

{
  this->_vptr_Mutex = (_func_int **)&PTR__Mutex_0015ba78;
  pthread_mutex_init((pthread_mutex_t *)&this->mutex,(pthread_mutexattr_t *)0x0);
  return;
}

Assistant:

Mutex::Mutex()
{
#ifdef _WIN32
  mutex = CreateMutex(NULL, FALSE, NULL);
  if (!mutex) {
    std::cerr << "Unable to create mutex: error code " << GetLastError()
              << std::endl;
  }
#else
  pthread_mutex_init(&mutex, NULL);
#endif
}